

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O2

SUNErrCode
SUNAdaptController_SetParams_Soderlind
          (SUNAdaptController C,sunrealtype k1,sunrealtype k2,sunrealtype k3,sunrealtype k4,
          sunrealtype k5)

{
  sunrealtype *psVar1;
  
  psVar1 = (sunrealtype *)C->content;
  *psVar1 = k1;
  psVar1[1] = k2;
  psVar1[2] = k3;
  psVar1[3] = k4;
  psVar1[4] = k5;
  if ((((k3 != 0.0) || (NAN(k3))) || (k5 != 0.0)) || (NAN(k5))) {
    *(undefined4 *)((long)psVar1 + 0x54) = 2;
  }
  else if (((k2 != 0.0) || (NAN(k2))) || ((k4 != 0.0 || (NAN(k4))))) {
    *(undefined4 *)((long)psVar1 + 0x54) = 1;
  }
  else {
    *(undefined4 *)((long)psVar1 + 0x54) = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_SetParams_Soderlind(SUNAdaptController C,
                                                  sunrealtype k1,
                                                  sunrealtype k2, sunrealtype k3,
                                                  sunrealtype k4, sunrealtype k5)
{
  SUNFunctionBegin(C->sunctx);
  SODERLIND_K1(C) = k1;
  SODERLIND_K2(C) = k2;
  SODERLIND_K3(C) = k3;
  SODERLIND_K4(C) = k4;
  SODERLIND_K5(C) = k5;

  if (k5 != SUN_RCONST(0.0) || k3 != SUN_RCONST(0.0))
  {
    SODERLIND_HISTORYSIZE(C) = 2;
  }
  else if (k4 != SUN_RCONST(0.0) || k2 != SUN_RCONST(0.0))
  {
    SODERLIND_HISTORYSIZE(C) = 1;
  }
  else { SODERLIND_HISTORYSIZE(C) = 0; }
  return SUN_SUCCESS;
}